

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# API.cpp
# Opt level: O1

__sighandler_t __thiscall
AGSSockAPI::Beacon::signal(Beacon *this,int __sig,__sighandler_t __handler)

{
  ulong in_RAX;
  char sig [1];
  undefined8 uStack_8;
  
  uStack_8 = (__sighandler_t)(in_RAX & 0xffffffffffffff);
  write((this->data).fd[1],(void *)((long)&uStack_8 + 7),1);
  return uStack_8;
}

Assistant:

void Beacon::signal()
{
	const char sig[] = "";
#if defined(_WIN32) && (IMPL_MODE == 1)
	send(data.fd, sig, sizeof (sig), 0);
#elif defined(_WIN32) && (IMPL_MODE == 2)
	closesocket(data.fd);
#else
	write(data.fd[1], sig, sizeof (sig));
#endif
}